

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupAbsGates(Gia_Man_t *p,Vec_Int_t *vGateClasses)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *p_01;
  bool bVar7;
  int local_5c;
  int i;
  Gia_Obj_t *pCopy;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Int_t *vNodes;
  Vec_Int_t *vFlops;
  Vec_Int_t *vPPis;
  Vec_Int_t *vPis;
  Vec_Int_t *vGateClasses_local;
  Gia_Man_t *p_local;
  
  vPis = vGateClasses;
  vGateClasses_local = (Vec_Int_t *)p;
  iVar2 = Gia_ManPoNum(p);
  if (iVar2 != 1) {
    __assert_fail("Gia_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                  ,0xe2,"Gia_Man_t *Gia_ManDupAbsGates(Gia_Man_t *, Vec_Int_t *)");
  }
  iVar2 = Vec_IntSize(vPis);
  iVar3 = Gia_ManObjNum((Gia_Man_t *)vGateClasses_local);
  if (iVar2 != iVar3) {
    __assert_fail("Vec_IntSize(vGateClasses) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                  ,0xe3,"Gia_Man_t *Gia_ManDupAbsGates(Gia_Man_t *, Vec_Int_t *)");
  }
  Gia_ManGlaCollect((Gia_Man_t *)vGateClasses_local,vPis,&vPPis,&vFlops,&vNodes,(Vec_Int_t **)&pNew)
  ;
  p_00 = Gia_ManStart(5000);
  pcVar5 = Abc_UtilStrsav(*(char **)vGateClasses_local);
  p_00->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav((char *)vGateClasses_local->pArray);
  p_00->pSpec = pcVar5;
  Gia_ManFillValue((Gia_Man_t *)vGateClasses_local);
  pGVar6 = Gia_ManConst0((Gia_Man_t *)vGateClasses_local);
  pGVar6->Value = 0;
  local_5c = 0;
  while( true ) {
    iVar2 = Vec_IntSize(vPPis);
    pVVar1 = vGateClasses_local;
    bVar7 = false;
    if (local_5c < iVar2) {
      iVar2 = Vec_IntEntry(vPPis,local_5c);
      pCopy = Gia_ManObj((Gia_Man_t *)pVVar1,iVar2);
      bVar7 = pCopy != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar4 = Gia_ManAppendCi(p_00);
    pCopy->Value = uVar4;
    local_5c = local_5c + 1;
  }
  local_5c = 0;
  while( true ) {
    iVar2 = Vec_IntSize(vFlops);
    pVVar1 = vGateClasses_local;
    bVar7 = false;
    if (local_5c < iVar2) {
      iVar2 = Vec_IntEntry(vFlops,local_5c);
      pCopy = Gia_ManObj((Gia_Man_t *)pVVar1,iVar2);
      bVar7 = pCopy != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar4 = Gia_ManAppendCi(p_00);
    pCopy->Value = uVar4;
    local_5c = local_5c + 1;
  }
  local_5c = 0;
  while( true ) {
    iVar2 = Vec_IntSize(vNodes);
    pVVar1 = vGateClasses_local;
    bVar7 = false;
    if (local_5c < iVar2) {
      iVar2 = Vec_IntEntry(vNodes,local_5c);
      pCopy = Gia_ManObj((Gia_Man_t *)pVVar1,iVar2);
      bVar7 = pCopy != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar4 = Gia_ManAppendCi(p_00);
    pCopy->Value = uVar4;
    local_5c = local_5c + 1;
  }
  local_5c = 0;
  while( true ) {
    iVar2 = Vec_IntSize((Vec_Int_t *)pNew);
    pVVar1 = vGateClasses_local;
    bVar7 = false;
    if (local_5c < iVar2) {
      iVar2 = Vec_IntEntry((Vec_Int_t *)pNew,local_5c);
      pCopy = Gia_ManObj((Gia_Man_t *)pVVar1,iVar2);
      bVar7 = pCopy != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar2 = Gia_ObjFanin0Copy(pCopy);
    iVar3 = Gia_ObjFanin1Copy(pCopy);
    uVar4 = Gia_ManAppendAnd(p_00,iVar2,iVar3);
    pCopy->Value = uVar4;
    local_5c = local_5c + 1;
  }
  local_5c = 0;
  while( true ) {
    iVar2 = Gia_ManPoNum((Gia_Man_t *)vGateClasses_local);
    bVar7 = false;
    if (local_5c < iVar2) {
      pCopy = Gia_ManCo((Gia_Man_t *)vGateClasses_local,local_5c);
      bVar7 = pCopy != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar2 = Gia_ObjFanin0Copy(pCopy);
    uVar4 = Gia_ManAppendCo(p_00,iVar2);
    pCopy->Value = uVar4;
    local_5c = local_5c + 1;
  }
  local_5c = 0;
  while( true ) {
    iVar2 = Vec_IntSize(vNodes);
    pVVar1 = vGateClasses_local;
    bVar7 = false;
    if (local_5c < iVar2) {
      iVar2 = Vec_IntEntry(vNodes,local_5c);
      pCopy = Gia_ManObj((Gia_Man_t *)pVVar1,iVar2);
      bVar7 = pCopy != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    pGVar6 = Gia_ObjRoToRi((Gia_Man_t *)vGateClasses_local,pCopy);
    iVar2 = Gia_ObjFanin0Copy(pGVar6);
    uVar4 = Gia_ManAppendCo(p_00,iVar2);
    pGVar6 = Gia_ObjRoToRi((Gia_Man_t *)vGateClasses_local,pCopy);
    pGVar6->Value = uVar4;
    local_5c = local_5c + 1;
  }
  iVar2 = Vec_IntSize(vNodes);
  Gia_ManSetRegNum(p_00,iVar2);
  p_01 = Gia_ManSeqCleanup(p_00);
  iVar2 = Gia_ManObjNum(p_00);
  iVar3 = Gia_ManObjNum(p_01);
  if (iVar2 != iVar3) {
    local_5c = 0;
    while( true ) {
      bVar7 = false;
      if (local_5c < *(int *)&vGateClasses_local[1].pArray) {
        pCopy = Gia_ManObj((Gia_Man_t *)vGateClasses_local,local_5c);
        bVar7 = pCopy != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      if (pCopy->Value != 0xffffffff) {
        iVar2 = Abc_LitIsCompl(pCopy->Value);
        if (iVar2 != 0) {
          __assert_fail("!Abc_LitIsCompl(pObj->Value)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                        ,0x10d,"Gia_Man_t *Gia_ManDupAbsGates(Gia_Man_t *, Vec_Int_t *)");
        }
        pGVar6 = Gia_ObjCopy(p_00,pCopy);
        if (pGVar6->Value == 0xffffffff) {
          Vec_IntWriteEntry(vPis,local_5c,0);
          pCopy->Value = 0xffffffff;
        }
        else {
          iVar2 = Abc_LitIsCompl(pGVar6->Value);
          if (iVar2 != 0) {
            __assert_fail("!Abc_LitIsCompl(pCopy->Value)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absDup.c"
                          ,0x115,"Gia_Man_t *Gia_ManDupAbsGates(Gia_Man_t *, Vec_Int_t *)");
          }
          pCopy->Value = pGVar6->Value;
        }
      }
      local_5c = local_5c + 1;
    }
  }
  Gia_ManStop(p_00);
  Vec_IntFree(vPPis);
  Vec_IntFree(vFlops);
  Vec_IntFree(vNodes);
  Vec_IntFree((Vec_Int_t *)pNew);
  return p_01;
}

Assistant:

Gia_Man_t * Gia_ManDupAbsGates( Gia_Man_t * p, Vec_Int_t * vGateClasses )
{ 
    Vec_Int_t * vPis, * vPPis, * vFlops, * vNodes;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pCopy;
    int i;//, nFlops = 0;
    assert( Gia_ManPoNum(p) == 1 );
    assert( Vec_IntSize(vGateClasses) == Gia_ManObjNum(p) );

    // create additional arrays
    Gia_ManGlaCollect( p, vGateClasses, &vPis, &vPPis, &vFlops, &vNodes );

    // start the new manager
    pNew = Gia_ManStart( 5000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create constant
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    // create PIs
    Gia_ManForEachObjVec( vPis, p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create additional PIs
    Gia_ManForEachObjVec( vPPis, p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create ROs
    Gia_ManForEachObjVec( vFlops, p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create internal nodes
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
//        Gia_ManDupAbsGates_rec( pNew, pObj );
    // create PO
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // create RIs
    Gia_ManForEachObjVec( vFlops, p, pObj, i )
        Gia_ObjRoToRi(p, pObj)->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ObjRoToRi(p, pObj)) );
    Gia_ManSetRegNum( pNew, Vec_IntSize(vFlops) );
    // clean up
    pNew = Gia_ManSeqCleanup( pTemp = pNew );
    // transfer copy values: (p -> pTemp -> pNew) => (p -> pNew)
    if ( Gia_ManObjNum(pTemp) != Gia_ManObjNum(pNew) )
    {
//        printf( "Gia_ManDupAbsGates() Internal error: object mismatch.\n" );
        Gia_ManForEachObj( p, pObj, i )
        {
            if ( !~pObj->Value )
                continue;
            assert( !Abc_LitIsCompl(pObj->Value) );
            pCopy = Gia_ObjCopy( pTemp, pObj );
            if ( !~pCopy->Value )
            {
                Vec_IntWriteEntry( vGateClasses, i, 0 );
                pObj->Value = ~0;
                continue;
            }
            assert( !Abc_LitIsCompl(pCopy->Value) );
            pObj->Value = pCopy->Value;
        }
    }
    Gia_ManStop( pTemp );

    Vec_IntFree( vPis );
    Vec_IntFree( vPPis );
    Vec_IntFree( vFlops );
    Vec_IntFree( vNodes );
    return pNew;
}